

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_HandleXrun(PaAlsaStream *self)

{
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  char *format;
  undefined1 *__s;
  bool bVar7;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  long local_40;
  snd_timestamp_t t;
  
  uStack_50 = 0x10e3ab;
  t.tv_usec = (__suseconds_t)PaUtil_GetTime();
  uStack_50 = 0x10e3b5;
  __n = snd_pcm_status_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_48 + lVar2;
  iVar4 = 0;
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e3d3;
  memset(__s,0,__n);
  bVar7 = true;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e3ea;
    puVar5 = __s;
    snd_pcm_status();
    iVar4 = (int)puVar5;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e3f2;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 == 4) {
      iVar4 = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e406;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->underrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->playback).canMmap == 0) {
        psVar1 = (self->playback).pcm;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0xffffffffffffffe0;
        uVar6 = *(undefined8 *)(auStack_48 + lVar2 + -8);
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e455;
        iVar3 = snd_pcm_recover(psVar1,uVar6,0);
        iVar4 = (int)uVar6;
        bVar7 = -1 < iVar3;
      }
      else {
        bVar7 = false;
      }
    }
  }
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e473;
    puVar5 = __s;
    snd_pcm_status();
    iVar4 = (int)puVar5;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e47b;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 == 4) {
      iVar4 = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e48f;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->overrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->capture).canMmap == 0) {
        psVar1 = (self->capture).pcm;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0xffffffffffffffe0;
        uVar6 = *(undefined8 *)(auStack_48 + lVar2 + -8);
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e4e0;
        iVar3 = snd_pcm_recover(psVar1,uVar6,0);
        iVar4 = (int)uVar6;
        if ((bool)(-1 < iVar3 & bVar7)) {
          return 0;
        }
      }
      goto LAB_0010e4f1;
    }
  }
  if (bVar7) {
    return 0;
  }
LAB_0010e4f1:
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e500;
  paUtilErr_ = PaUnixMutex_Lock(&self->stateMtx);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaUnixMutex_Lock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3239\n"
    ;
    goto LAB_0010e596;
  }
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e512;
  paUtilErr_ = AlsaStop(self,iVar4);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'AlsaStop( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3240\n"
    ;
    goto LAB_0010e596;
  }
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e524;
  paUtilErr_ = AlsaStart(self,iVar4);
  iVar4 = 0;
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3241\n"
    ;
    goto LAB_0010e596;
  }
  while( true ) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e538;
    paUtilErr_ = PaUnixMutex_Unlock(&self->stateMtx);
    format = 
    "Expression \'PaUnixMutex_Unlock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3246\n"
    ;
    if (-1 < paUtilErr_) break;
LAB_0010e596:
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e59d;
    PaUtil_DebugPrint(format);
    iVar4 = paUtilErr_;
  }
  if (-1 < iVar4) {
    paUtilErr_ = iVar4;
    return 0;
  }
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x10e57d;
  paUtilErr_ = iVar4;
  PaUtil_DebugPrint(
                   "Expression \'AlsaRestart( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3308\n"
                   );
  return paUtilErr_;
}

Assistant:

static PaError PaAlsaStream_HandleXrun( PaAlsaStream *self )
{
    PaError result = paNoError;
    snd_pcm_status_t *st;
    PaTime now = PaUtil_GetTime();
    snd_timestamp_t t;
    int restartAlsa = 0; /* do not restart Alsa by default */

    alsa_snd_pcm_status_alloca( &st );

    if( self->playback.pcm )
    {
        alsa_snd_pcm_status( self->playback.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->underrun = now * 1000 - ( (PaTime)t.tv_sec * 1000 + (PaTime)t.tv_usec / 1000 );

            if( !self->playback.canMmap )
            {
                if( alsa_snd_pcm_recover( self->playback.pcm, -EPIPE, 0 ) < 0 )
                {
                    PA_DEBUG(( "%s: [playback] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }
    if( self->capture.pcm )
    {
        alsa_snd_pcm_status( self->capture.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->overrun = now * 1000 - ((PaTime) t.tv_sec * 1000 + (PaTime) t.tv_usec / 1000);

            if (!self->capture.canMmap)
            {
                if (alsa_snd_pcm_recover( self->capture.pcm, -EPIPE, 0 ) < 0)
                {
                    PA_DEBUG(( "%s: [capture] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }

    if( restartAlsa )
    {
        PA_DEBUG(( "%s: restarting Alsa to recover from XRUN\n", __FUNCTION__ ));
        PA_ENSURE( AlsaRestart( self ) );
    }

end:
    return result;
error:
    goto end;
}